

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qkmsdevice.cpp
# Opt level: O0

void __thiscall QKmsOutput::restoreMode(QKmsOutput *this,QKmsDevice *device)

{
  int iVar1;
  QKmsDevice *in_RSI;
  long in_RDI;
  
  if (((*(byte *)(in_RDI + 0x40) & 1) != 0) && (*(long *)(in_RDI + 0x48) != 0)) {
    iVar1 = QKmsDevice::fd(in_RSI);
    drmModeSetCrtc(iVar1,**(undefined4 **)(in_RDI + 0x48),
                   *(undefined4 *)(*(long *)(in_RDI + 0x48) + 4),0,0,in_RDI + 0x18,1,
                   *(long *)(in_RDI + 0x48) + 0x1c);
    *(undefined1 *)(in_RDI + 0x40) = 0;
  }
  return;
}

Assistant:

void QKmsOutput::restoreMode(QKmsDevice *device)
{
    if (mode_set && saved_crtc) {
        drmModeSetCrtc(device->fd(),
                       saved_crtc->crtc_id,
                       saved_crtc->buffer_id,
                       0, 0,
                       &connector_id, 1,
                       &saved_crtc->mode);
        mode_set = false;
    }
}